

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_access_chain(CompilerHLSL *this,Instruction *instruction)

{
  uint uVar1;
  uint32_t base_00;
  Variant *pVVar2;
  bool bVar3;
  int iVar4;
  uint32_t *args;
  SPIRType *pSVar5;
  ulong uVar6;
  SPIRVariable *pSVar7;
  SPIRType *basetype;
  SPIRAccessChain *e;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  bool row_major_matrix;
  uint32_t array_stride;
  uint32_t matrix_stride;
  SPIRAccessChain *local_90;
  SPIRType *local_88;
  string base;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  offsets;
  
  args = Compiler::stream((Compiler *)this,instruction);
  uVar1 = instruction->length;
  pSVar5 = Compiler::expression_type((Compiler *)this,args[2]);
  uVar6 = (ulong)args[2];
  uVar10 = 0;
  if ((uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar6].type == TypeAccessChain)) {
    local_90 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar6);
  }
  else {
    local_90 = (SPIRAccessChain *)0x0;
  }
  if (((local_90 == (SPIRAccessChain *)0x0) &&
      (((pSVar5->storage != StorageClassStorageBuffer &&
        (bVar3 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,
                            DecorationBufferBlock), !bVar3)) ||
       (uVar10 = (pSVar5->array).super_VectorView<unsigned_int>.buffer_size, uVar1 - 3 <= uVar10))))
     || ((local_88 = pSVar5, pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,args[2])
         , pSVar7 != (SPIRVariable *)0x0 &&
         (iVar4 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])
                            (this,(ulong)(pSVar7->super_IVariant).self.id), (char)iVar4 != '\0'))))
  {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
    return;
  }
  pSVar5 = local_88;
  base._M_dataplus._M_p = (pointer)&base.field_2;
  base._M_string_length = 0;
  base.field_2._M_local_buf[0] = '\0';
  uVar8 = (uint32_t)uVar10;
  if (uVar8 == 0) {
    if (local_90 != (SPIRAccessChain *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)&base);
      goto LAB_0017a7de;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&offsets.first,&this->super_CompilerGLSL,args[2],true);
    ::std::__cxx11::string::operator=((string *)&base,(string *)&offsets);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)offsets.first._M_dataplus._M_p == &offsets.first.field_2) goto LAB_0017a7de;
  }
  else {
    base_00 = args[2];
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *args);
    CompilerGLSL::access_chain_abi_cxx11_
              (&offsets.first,&this->super_CompilerGLSL,base_00,args + 3,uVar8,pSVar5,
               (AccessChainMeta *)0x0,false);
    ::std::__cxx11::string::operator=((string *)&base,(string *)&offsets);
    pSVar5 = local_88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)offsets.first._M_dataplus._M_p == &offsets.first.field_2) goto LAB_0017a7de;
  }
  operator_delete(offsets.first._M_dataplus._M_p);
LAB_0017a7de:
  basetype = Compiler::get_pointee_type((Compiler *)this,pSVar5);
  if (uVar8 != 0) {
    uVar10 = uVar10 & 0xffffffff;
    do {
      uVar6 = (ulong)(basetype->parent_type).id;
      if (uVar6 == 0) {
        __assert_fail("basetype->parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_hlsl.cpp"
                      ,0x140c,
                      "void spirv_cross::CompilerHLSL::emit_access_chain(const Instruction &)");
      }
      basetype = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + uVar6);
      uVar9 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  matrix_stride = 0;
  array_stride = 0;
  row_major_matrix = false;
  if (local_90 != (SPIRAccessChain *)0x0) {
    matrix_stride = local_90->matrix_stride;
    row_major_matrix = local_90->row_major_matrix;
    array_stride = local_90->array_stride;
  }
  CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
            (&offsets,&this->super_CompilerGLSL,basetype,args + (uVar8 + 3),(uVar1 - uVar8) - 3,0,1,
             &row_major_matrix,&matrix_stride,&array_stride,false);
  e = Compiler::
      set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
                ((Compiler *)this,args[1],args,&pSVar5->storage,&base,&offsets.first,&offsets.second
                );
  e->row_major_matrix = row_major_matrix;
  e->matrix_stride = matrix_stride;
  e->array_stride = array_stride;
  bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[2]);
  e->immutable = bVar3;
  if (pSVar7 == (SPIRVariable *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (pSVar7->super_IVariant).self.id;
  }
  (e->loaded_from).id = uVar8;
  if (local_90 != (SPIRAccessChain *)0x0) {
    ::std::__cxx11::string::_M_append
              ((char *)&e->dynamic_index,(ulong)(local_90->dynamic_index)._M_dataplus._M_p);
    e->static_index = e->static_index + local_90->static_index;
  }
  if (2 < uVar1) {
    uVar10 = 2;
    do {
      Compiler::inherit_expression_dependencies((Compiler *)this,args[1],args[uVar10]);
      Compiler::add_implied_read_expression((Compiler *)this,e,args[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsets.first._M_dataplus._M_p != &offsets.first.field_2) {
    operator_delete(offsets.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base._M_dataplus._M_p != &base.field_2) {
    operator_delete(base._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_access_chain(const Instruction &instruction)
{
	auto ops = stream(instruction);
	uint32_t length = instruction.length;

	bool need_byte_access_chain = false;
	auto &type = expression_type(ops[2]);
	const auto *chain = maybe_get<SPIRAccessChain>(ops[2]);

	if (chain)
	{
		// Keep tacking on an existing access chain.
		need_byte_access_chain = true;
	}
	else if (type.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock))
	{
		// If we are starting to poke into an SSBO, we are dealing with ByteAddressBuffers, and we need
		// to emit SPIRAccessChain rather than a plain SPIRExpression.
		uint32_t chain_arguments = length - 3;
		if (chain_arguments > type.array.size())
			need_byte_access_chain = true;
	}

	if (need_byte_access_chain)
	{
		// If we have a chain variable, we are already inside the SSBO, and any array type will refer to arrays within a block,
		// and not array of SSBO.
		uint32_t to_plain_buffer_length = chain ? 0u : static_cast<uint32_t>(type.array.size());

		auto *backing_variable = maybe_get_backing_variable(ops[2]);

		if (backing_variable != nullptr && is_user_type_structured(backing_variable->self))
		{
			CompilerGLSL::emit_instruction(instruction);
			return;
		}

		string base;
		if (to_plain_buffer_length != 0)
			base = access_chain(ops[2], &ops[3], to_plain_buffer_length, get<SPIRType>(ops[0]));
		else if (chain)
			base = chain->base;
		else
			base = to_expression(ops[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *basetype = &get_pointee_type(type);

		// Traverse the type hierarchy down to the actual buffer types.
		for (uint32_t i = 0; i < to_plain_buffer_length; i++)
		{
			assert(basetype->parent_type);
			basetype = &get<SPIRType>(basetype->parent_type);
		}

		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool row_major_matrix = false;

		// Inherit matrix information.
		if (chain)
		{
			matrix_stride = chain->matrix_stride;
			row_major_matrix = chain->row_major_matrix;
			array_stride = chain->array_stride;
		}

		auto offsets = flattened_access_chain_offset(*basetype, &ops[3 + to_plain_buffer_length],
		                                             length - 3 - to_plain_buffer_length, 0, 1, &row_major_matrix,
		                                             &matrix_stride, &array_stride);

		auto &e = set<SPIRAccessChain>(ops[1], ops[0], type.storage, base, offsets.first, offsets.second);
		e.row_major_matrix = row_major_matrix;
		e.matrix_stride = matrix_stride;
		e.array_stride = array_stride;
		e.immutable = should_forward(ops[2]);
		e.loaded_from = backing_variable ? backing_variable->self : ID(0);

		if (chain)
		{
			e.dynamic_index += chain->dynamic_index;
			e.static_index += chain->static_index;
		}

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(e, ops[i]);
		}
	}
	else
	{
		CompilerGLSL::emit_instruction(instruction);
	}
}